

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_validation.h
# Opt level: O2

void Image_Function::
     OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
               (uint32_t *width,uint32_t *height,ImageTemplate<unsigned_char> *image,
               ImageTemplate<unsigned_char> *args,ImageTemplate<unsigned_char> *args_1)

{
  uint32_t width_00;
  uint uVar1;
  uint uVar2;
  bool bVar3;
  ImageTemplate<unsigned_char> IStack_78;
  ImageTemplate<unsigned_char> local_50;
  
  width_00 = *width;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_50,args);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&IStack_78,args_1);
  bVar3 = IsFullImageRow<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
                    (width_00,image,&local_50,&IStack_78);
  if (bVar3) {
    uVar1 = *width;
    uVar2 = *height;
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&IStack_78);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_50);
    if (uVar1 < (uint)(0xffffffff / (ulong)uVar2)) {
      *width = *height * *width;
      *height = 1;
    }
  }
  else {
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&IStack_78);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_50);
  }
  return;
}

Assistant:

void OptimiseRoi( uint32_t & width, uint32_t & height, const TImage & image, Args... args )
    {
        if( IsFullImageRow(width, image, args...) && ( width < (std::numeric_limits<uint32_t>::max() / height) ) ) {
            width = width * height;
            height = 1u;
        }
    }